

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::BeginPopup(char *str_id,ImGuiWindowFlags flags)

{
  bool bVar1;
  ImGuiID id;
  
  if ((GImGui->BeginPopupStack).Size < (GImGui->OpenPopupStack).Size) {
    id = ImGuiWindow::GetID(GImGui->CurrentWindow,str_id,(char *)0x0);
    bVar1 = BeginPopupEx(id,flags | 0x141);
    return bVar1;
  }
  (GImGui->NextWindowData).Flags = 0;
  return false;
}

Assistant:

bool ImGui::BeginPopup(const char* str_id, ImGuiWindowFlags flags)
{
    ImGuiContext& g = *GImGui;
    if (g.OpenPopupStack.Size <= g.BeginPopupStack.Size) // Early out for performance
    {
        g.NextWindowData.ClearFlags(); // We behave like Begin() and need to consume those values
        return false;
    }
    flags |= ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoSavedSettings;
    ImGuiID id = g.CurrentWindow->GetID(str_id);
    return BeginPopupEx(id, flags);
}